

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPrimitiveDefaults::~RepeatedPrimitiveDefaults
          (RepeatedPrimitiveDefaults *this)

{
  RepeatedField<bool> *in_RDI;
  
  RepeatedField<bool>::~RepeatedField(in_RDI);
  RepeatedField<float>::~RepeatedField((RepeatedField<float> *)in_RDI);
  RepeatedField<double>::~RepeatedField((RepeatedField<double> *)in_RDI);
  RepeatedField<unsigned_long>::~RepeatedField((RepeatedField<unsigned_long> *)in_RDI);
  RepeatedField<unsigned_int>::~RepeatedField((RepeatedField<unsigned_int> *)in_RDI);
  RepeatedField<long>::~RepeatedField((RepeatedField<long> *)in_RDI);
  RepeatedField<int>::~RepeatedField((RepeatedField<int> *)in_RDI);
  return;
}

Assistant:

class PROTOBUF_EXPORT RepeatedPrimitiveDefaults {
 private:
  template <typename Type>
  friend class RepeatedPrimitiveTypeTraits;
  static const RepeatedPrimitiveDefaults* default_instance();
  RepeatedField<int32> default_repeated_field_int32_;
  RepeatedField<int64> default_repeated_field_int64_;
  RepeatedField<uint32> default_repeated_field_uint32_;
  RepeatedField<uint64> default_repeated_field_uint64_;
  RepeatedField<double> default_repeated_field_double_;
  RepeatedField<float> default_repeated_field_float_;
  RepeatedField<bool> default_repeated_field_bool_;
}